

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strbuf.c
# Opt level: O3

void strbuf_BinarySink_write(BinarySink *bs,void *data,size_t len)

{
  BinarySink *pBVar1;
  _func_void_BinarySink_ptr_char_ptr___va_list_tag_ptr *p_Var2;
  BinarySink *pBVar3;
  
  p_Var2 = (_func_void_BinarySink_ptr_char_ptr___va_list_tag_ptr *)
           safegrowarray(bs[-1].write,(size_t *)&bs[-2].binarysink_,1,
                         (size_t)((long)&(bs[-1].binarysink_)->write + 1),len,*(_Bool *)&bs[1].write
                        );
  bs[-1].write = (_func_void_BinarySink_ptr_void_ptr_size_t *)p_Var2;
  bs[-1].writefmtv = p_Var2;
  pBVar1 = bs[-1].binarysink_;
  pBVar3 = (BinarySink *)((long)&pBVar1->write + len);
  bs[-1].binarysink_ = pBVar3;
  p_Var2[(long)pBVar3] = (_func_void_BinarySink_ptr_char_ptr___va_list_tag_ptr)0x0;
  memcpy(p_Var2 + (long)pBVar1,data,len);
  return;
}

Assistant:

static void strbuf_BinarySink_write(
    BinarySink *bs, const void *data, size_t len)
{
    strbuf *buf_o = BinarySink_DOWNCAST(bs, strbuf);
    memcpy(strbuf_append(buf_o, len), data, len);
}